

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O1

void ParseOldDecoration(FScanner *sc,EDefinitionType def)

{
  uint *puVar1;
  double dVar2;
  PClassActor *parent;
  BYTE *pBVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  ClassReg *pCVar7;
  PClassActor *info;
  FState *pFVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int32_t *piVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  FState *pFVar16;
  double dVar17;
  TArray<FState,_FState> StateArray;
  FExtraInfo extra;
  TArray<FScriptPosition,_FScriptPosition> SourceLines;
  FState icecopy;
  Baggage bag;
  FScriptPosition icepos;
  TArray<FState,_FState> local_178;
  EDefinitionType local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  TArray<FScriptPosition,_FScriptPosition> local_118;
  int local_fc;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  Baggage local_c8;
  FScriptPosition local_48;
  FName local_38;
  FName local_34;
  
  local_c8.ClassName.Chars = FString::NullString.Nothing;
  local_c8.statedef.StateLabels.Array = (FStateDefine *)0x0;
  local_c8.statedef.StateLabels.Most = 0;
  local_c8.statedef.StateLabels.Count = 0;
  local_c8.statedef.laststate = (FState *)0x0;
  local_c8.statedef.laststatebeforelabel = (FState *)0x0;
  local_c8.statedef.StateArray.Array = (FState *)0x0;
  local_c8.statedef.StateArray.Most = 0;
  local_c8.statedef.StateArray.Count = 0;
  local_c8.statedef.SourceLines.Array = (FScriptPosition *)0x0;
  local_c8.statedef.SourceLines.Most = 0;
  local_c8.statedef.SourceLines.Count = 0;
  local_c8.statedef.lastlabel = -1;
  local_c8.ScriptPosition.FileName.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_c8.ScriptPosition.ScriptLine = 0;
  local_178.Array = (FState *)0x0;
  local_178.Most = 0;
  local_178.Count = 0;
  local_118.Array = (FScriptPosition *)0x0;
  local_118.Most = 0;
  local_118.Count = 0;
  if (def == DEF_Pickup) {
    pCVar7 = &AFakeInventory::RegistrationInfo;
  }
  else {
    pCVar7 = &AActor::RegistrationInfo;
  }
  parent = (PClassActor *)pCVar7->MyClass;
  FScanner::MustGetString(sc);
  iVar6 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
  FScriptPosition::FScriptPosition((FScriptPosition *)local_f8,sc);
  local_fc = iVar6;
  local_34.Index = iVar6;
  info = DecoDerivedClass((FScriptPosition *)local_f8,parent,&local_34);
  FString::~FString((FString *)local_f8);
  local_c8.DropItemList = (DDropItem *)0x0;
  local_c8.DropItemSet = false;
  local_c8.CurrentState = 0;
  local_c8.StateSet = false;
  local_c8.fromDecorate = true;
  FStateDefinitions::MakeStateDefines(&local_c8.statedef,parent);
  local_c8.fromDecorate = true;
  local_c8.Info = info;
  FString::operator=(&local_c8.ClassName,
                     FName::NameData.NameArray
                     [(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      TypeName.Index].Text);
  info->GameFilter = '\0';
  FScanner::MustGetStringName(sc,"{");
  local_128 = 0.0;
  dStack_120 = 0.0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  pBVar3 = (info->super_PClass).Defaults;
  local_f8._4_4_ = local_f8._4_4_ & 0xffffff00;
  local_f8._0_4_ = 0x31544e54;
  FScanner::MustGetString(sc);
  bVar5 = FScanner::Compare(sc,"}");
  if (!bVar5) {
    local_15c = def | DEF_Pickup;
    do {
      bVar5 = FScanner::Compare(sc,"DoomEdNum");
      if (bVar5) {
        FScanner::MustGetNumber(sc);
        if (sc->Number - 0x8000U < 0xffff7fff) {
          FScanner::ScriptError(sc,"DoomEdNum must be in the range [-1,32767]");
        }
        (local_c8.Info)->DoomEdNum = (SWORD)sc->Number;
      }
      else {
        bVar5 = FScanner::Compare(sc,"SpawnNum");
        if (bVar5) {
          FScanner::MustGetNumber(sc);
          if (0xff < (uint)sc->Number) {
            FScanner::ScriptError(sc,"SpawnNum must be in the range [0,255]");
          }
          (local_c8.Info)->SpawnID = (ushort)(byte)sc->Number;
        }
        else {
          bVar5 = FScanner::Compare(sc,"Sprite");
          if (!bVar5) {
            if ((local_15c != DEF_Projectile) ||
               (bVar5 = FScanner::Compare(sc,"DeathSprite"), !bVar5)) {
              bVar5 = FScanner::Compare(sc,"Frames");
              if (bVar5) {
                FScanner::MustGetString(sc);
                uStack_150 = CONCAT44(uStack_150._4_4_,local_178.Count);
                ParseSpriteFrames(local_c8.Info,&local_178,&local_118,sc);
                uStack_150 = CONCAT44(local_178.Count,(uint)uStack_150);
              }
              else if ((local_15c == DEF_Projectile) &&
                      (bVar5 = FScanner::Compare(sc,"DeathFrames"), bVar5)) {
                FScanner::MustGetString(sc);
                local_148 = CONCAT44(local_148._4_4_,local_178.Count);
                ParseSpriteFrames(local_c8.Info,&local_178,&local_118,sc);
                local_148 = CONCAT44(local_178.Count,(uint)local_148);
              }
              else if (def == DEF_BreakableDecoration) {
                bVar5 = FScanner::Compare(sc,"IceDeathFrames");
                if (bVar5) {
                  FScanner::MustGetString(sc);
                  uStack_140 = CONCAT44(uStack_140._4_4_,local_178.Count);
                  ParseSpriteFrames(local_c8.Info,&local_178,&local_118,sc);
                  uStack_140 = CONCAT44(local_178.Count,(uint)uStack_140);
                }
                else {
                  bVar5 = FScanner::Compare(sc,"BurnDeathFrames");
                  if (bVar5) {
                    FScanner::MustGetString(sc);
                    local_138 = CONCAT44(local_138._4_4_,local_178.Count);
                    ParseSpriteFrames(local_c8.Info,&local_178,&local_118,sc);
                    local_138 = CONCAT44(local_178.Count,(uint)local_138);
                  }
                  else {
                    bVar5 = FScanner::Compare(sc,"GenericIceDeath");
                    if (bVar5) {
                      uStack_130._0_5_ = CONCAT14(1,(undefined4)uStack_130);
                    }
                    else {
                      bVar5 = FScanner::Compare(sc,"BurnsAway");
                      if (bVar5) {
                        uStack_130._0_3_ = CONCAT12(1,(undefined2)uStack_130);
                      }
                      else {
                        bVar5 = FScanner::Compare(sc,"DiesAway");
                        if (!bVar5) goto LAB_0053f783;
                        uStack_130._0_4_ = CONCAT13(1,(undefined3)uStack_130);
                      }
                    }
                  }
                }
              }
              else {
LAB_0053f783:
                bVar5 = FScanner::Compare(sc,"Alpha");
                if (bVar5) {
                  FScanner::MustGetFloat(sc);
                  dVar2 = sc->Float;
                  dVar17 = 1.0;
                  if (dVar2 <= 1.0) {
                    dVar17 = dVar2;
                  }
                  *(ulong *)(pBVar3 + 0x118) = -(ulong)(0.0 < dVar2) & (ulong)dVar17;
                }
                else {
                  bVar5 = FScanner::Compare(sc,"Scale");
                  if (bVar5) {
                    FScanner::MustGetFloat(sc);
                    dVar2 = sc->Float;
                    *(double *)(pBVar3 + 0x100) = dVar2;
                    *(double *)(pBVar3 + 0xf8) = dVar2;
                  }
                  else {
                    bVar5 = FScanner::Compare(sc,"RenderStyle");
                    if (bVar5) {
                      FScanner::MustGetString(sc);
                      iVar6 = FScanner::MustMatchString(sc,RenderStyles,8);
                      *(FRenderStyle *)(pBVar3 + 0x108) = LegacyRenderStyles[iVar6];
                    }
                    else {
                      bVar5 = FScanner::Compare(sc,"Radius");
                      if (bVar5) {
                        FScanner::MustGetFloat(sc);
                        *(double *)(pBVar3 + 0x178) = sc->Float;
                      }
                      else {
                        bVar5 = FScanner::Compare(sc,"Height");
                        if (bVar5) {
                          FScanner::MustGetFloat(sc);
                          *(double *)(pBVar3 + 0x180) = sc->Float;
                        }
                        else if (def == DEF_BreakableDecoration) {
                          bVar5 = FScanner::Compare(sc,"DeathHeight");
                          if (bVar5) {
                            FScanner::MustGetFloat(sc);
                            local_128 = sc->Float;
                          }
                          else {
                            bVar5 = FScanner::Compare(sc,"BurnHeight");
                            if (bVar5) {
                              FScanner::MustGetFloat(sc);
                              dStack_120 = sc->Float;
                            }
                            else {
                              bVar5 = FScanner::Compare(sc,"Health");
                              if (!bVar5) goto LAB_0053f954;
                              FScanner::MustGetNumber(sc);
                              *(int *)(pBVar3 + 0x1fc) = sc->Number;
                            }
                          }
                        }
                        else {
LAB_0053f954:
                          if (def == DEF_Projectile) {
                            bVar5 = FScanner::Compare(sc,"ExplosionRadius");
                            if (bVar5) {
                              FScanner::MustGetNumber(sc);
                              (local_c8.Info)->ExplosionRadius = sc->Number;
                            }
                            else {
                              bVar5 = FScanner::Compare(sc,"ExplosionDamage");
                              if (!bVar5) {
                                bVar5 = FScanner::Compare(sc,"DoNotHurtShooter");
                                if (bVar5) {
                                  (local_c8.Info)->DontHurtShooter = true;
                                }
                                else {
                                  bVar5 = FScanner::Compare(sc,"Damage");
                                  if (bVar5) {
                                    FScanner::MustGetNumber(sc);
                                    *(int *)(pBVar3 + 0x1a8) = sc->Number;
                                    pBVar3[0x1b0] = '\0';
                                    pBVar3[0x1b1] = '\0';
                                    pBVar3[0x1b2] = '\0';
                                    pBVar3[0x1b3] = '\0';
                                    pBVar3[0x1b4] = '\0';
                                    pBVar3[0x1b5] = '\0';
                                    pBVar3[0x1b6] = '\0';
                                    pBVar3[0x1b7] = '\0';
                                  }
                                  else {
                                    bVar5 = FScanner::Compare(sc,"DamageType");
                                    if (bVar5) {
                                      FScanner::MustGetString(sc);
                                      bVar5 = FScanner::Compare(sc,"Normal");
                                      if (bVar5) {
                                        pBVar3[0x404] = '\0';
                                        pBVar3[0x405] = '\0';
                                        pBVar3[0x406] = '\0';
                                        pBVar3[0x407] = '\0';
                                      }
                                      else {
                                        iVar6 = FName::NameManager::FindName
                                                          (&FName::NameData,sc->String,false);
                                        *(int *)(pBVar3 + 0x404) = iVar6;
                                      }
                                    }
                                    else {
                                      bVar5 = FScanner::Compare(sc,"Speed");
                                      if (!bVar5) goto LAB_0053fa9e;
                                      FScanner::MustGetFloat(sc);
                                      *(double *)(pBVar3 + 0xe0) = sc->Float;
                                    }
                                  }
                                }
                                goto LAB_0053f61f;
                              }
                              FScanner::MustGetNumber(sc);
                              (local_c8.Info)->ExplosionDamage = sc->Number;
                            }
                            uStack_130._0_6_ = CONCAT15(1,(undefined5)uStack_130);
                          }
                          else {
LAB_0053fa9e:
                            bVar5 = FScanner::Compare(sc,"Mass");
                            if (bVar5) {
                              FScanner::MustGetFloat(sc);
                              *(int *)(pBVar3 + 0x3f8) = (int)sc->Float;
                            }
                            else {
                              bVar5 = FScanner::Compare(sc,"Translation1");
                              if (bVar5) {
                                FScanner::MustGetNumber(sc);
                                if (2 < (uint)sc->Number) {
                                  FScanner::ScriptError
                                            (sc,"Translation1 must be in the range [0,2]");
                                }
                                uVar13 = sc->Number;
                                uVar10 = 0x30000;
                              }
                              else {
                                bVar5 = FScanner::Compare(sc,"Translation2");
                                if (!bVar5) {
                                  if ((local_15c == DEF_Projectile) &&
                                     (bVar5 = FScanner::Compare(sc,"DeathSound"), bVar5)) {
                                    FScanner::MustGetString(sc);
                                    iVar6 = S_FindSound(sc->String);
                                    *(int *)(pBVar3 + 0x3d0) = iVar6;
                                  }
                                  else if ((def == DEF_BreakableDecoration) &&
                                          (bVar5 = FScanner::Compare(sc,"BurnDeathSound"), bVar5)) {
                                    FScanner::MustGetString(sc);
                                    iVar6 = S_FindSound(sc->String);
                                    *(int *)(pBVar3 + 0x3d4) = iVar6;
                                  }
                                  else if (def == DEF_Projectile) {
                                    bVar5 = FScanner::Compare(sc,"SpawnSound");
                                    if (bVar5) {
                                      FScanner::MustGetString(sc);
                                      iVar6 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 0x3c4) = iVar6;
                                    }
                                    else {
                                      bVar5 = FScanner::Compare(sc,"DoomBounce");
                                      if (bVar5) {
                                        pBVar3[0x2d8] = 0xaf;
                                        pBVar3[0x2d9] = '\0';
                                      }
                                      else {
                                        bVar5 = FScanner::Compare(sc,"HereticBounce");
                                        if (bVar5) {
                                          pBVar3[0x2d8] = 0xc6;
                                          pBVar3[0x2d9] = '\0';
                                        }
                                        else {
                                          bVar5 = FScanner::Compare(sc,"HexenBounce");
                                          if (!bVar5) goto LAB_0053fca3;
                                          pBVar3[0x2d8] = 0x8f;
                                          pBVar3[0x2d9] = '\0';
                                        }
                                      }
                                    }
                                  }
                                  else {
LAB_0053fca3:
                                    if (def == DEF_Pickup) {
                                      bVar5 = FScanner::Compare(sc,"PickupSound");
                                      if (bVar5) {
                                        FScanner::MustGetString(sc);
                                        iVar6 = S_FindSound(sc->String);
                                        *(int *)(pBVar3 + 0x4f8) = iVar6;
                                      }
                                      else {
                                        bVar5 = FScanner::Compare(sc,"PickupMessage");
                                        if (bVar5) {
                                          FScanner::MustGetString(sc);
                                          FString::operator=((FString *)(local_c8.Info + 1),
                                                             sc->String);
                                        }
                                        else {
                                          bVar5 = FScanner::Compare(sc,"Respawns");
                                          if (!bVar5) goto LAB_0053fd3d;
                                          pBVar3[0x4fc] = '\x01';
                                        }
                                      }
                                    }
                                    else {
LAB_0053fd3d:
                                      if (def == DEF_BreakableDecoration) {
                                        bVar5 = FScanner::Compare(sc,"SolidOnDeath");
                                        if (bVar5) {
                                          uStack_130 = CONCAT71(uStack_130._1_7_,1);
                                        }
                                        else {
                                          bVar5 = FScanner::Compare(sc,"SolidOnBurn");
                                          if (!bVar5) goto LAB_0053fd7e;
                                          uStack_130._0_2_ = CONCAT11(1,(char)uStack_130);
                                        }
                                      }
                                      else {
LAB_0053fd7e:
                                        if (*sc->String == '*') {
                                          FScanner::ScriptError(sc,(char *)0x0);
                                        }
                                        else {
                                          HandleActorFlag(sc,&local_c8,sc->String,(char *)0x0,0x2b);
                                        }
                                      }
                                    }
                                  }
                                  goto LAB_0053f61f;
                                }
                                FScanner::MustGetNumber(sc);
                                if (0xfffe < (uint)sc->Number) {
                                  FScanner::ScriptError
                                            (sc,
                                             "Translation2 must be in the range [0,MAX_ACS_TRANSLATIONS]"
                                            );
                                }
                                uVar13 = sc->Number;
                                uVar10 = 0x40000;
                              }
                              *(uint *)(pBVar3 + 0x3c0) = uVar13 | uVar10;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0053f61f;
            }
            local_158 = CONCAT71(local_158._1_7_,1);
          }
          FScanner::MustGetString(sc);
          if (sc->StringLen != 4) {
            FScanner::ScriptError(sc,"Sprite name must be exactly four characters long");
          }
          if ((char)local_158 == '\x01') {
            local_158 = CONCAT44(local_158._4_4_,*(undefined4 *)sc->String);
          }
          else {
            local_f8._0_4_ = *(undefined4 *)sc->String;
          }
        }
      }
LAB_0053f61f:
      FScanner::MustGetString(sc);
      bVar5 = FScanner::Compare(sc,"}");
    } while (!bVar5);
  }
  iVar6 = GetSpriteIndex(local_f8,true);
  if ((ulong)local_178._8_8_ >> 0x20 != 0) {
    lVar14 = 0;
    do {
      *(int *)((long)&(local_178.Array)->sprite + lVar14) = iVar6;
      lVar14 = lVar14 + 0x28;
    } while (((ulong)local_178._8_8_ >> 0x20) * 0x28 != lVar14);
  }
  if (((char)local_158 != '\0') && (local_148._4_4_ != 0)) {
    iVar6 = GetSpriteIndex((char *)&local_158,true);
    if ((uint)local_148 < local_148._4_4_) {
      lVar14 = (ulong)local_148._4_4_ - (local_148 & 0xffffffff);
      piVar12 = &local_178.Array[local_148 & 0xffffffff].sprite;
      do {
        *piVar12 = iVar6;
        piVar12 = piVar12 + 10;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
  }
  (local_c8.Info)->NumOwnedStates = local_178.Count;
  if (local_178.Count == 0) {
    pcVar15 = "%s does not define any animation frames";
LAB_0053fdc5:
    FScanner::ScriptError(sc,pcVar15,FName::NameData.NameArray[local_fc].Text);
  }
  else {
    if (uStack_150._4_4_ == 0) {
      pcVar15 = "%s does not have a Frames definition";
      goto LAB_0053fdc5;
    }
    if ((def == DEF_BreakableDecoration) && (local_148._4_4_ == 0)) {
      pcVar15 = "%s does not have a DeathFrames definition";
      goto LAB_0053fdc5;
    }
    if ((uStack_140._4_4_ != 0) && (uStack_130._4_1_ == '\x01')) {
      FScanner::ScriptError(sc,"You cannot use IceDeathFrames and GenericIceDeath together");
    }
  }
  if (uStack_140._4_4_ != 0) {
    uVar13 = uStack_140._4_4_ - 1;
    local_f8._0_8_ = local_178.Array[uVar13].NextState;
    local_f8._8_8_ = local_178.Array[uVar13].ActionFunc;
    pFVar8 = local_178.Array + uVar13;
    local_e8._0_4_ = pFVar8->sprite;
    local_e8._4_2_ = pFVar8->Tics;
    local_e8._6_2_ = pFVar8->TicRange;
    uStack_e0 = *(undefined8 *)(&pFVar8->sprite + 2);
    local_d8._0_4_ = local_178.Array[uVar13].Misc1;
    local_d8._4_4_ = local_178.Array[uVar13].Misc2;
    FScriptPosition::FScriptPosition(&local_48,local_118.Array + uVar13);
    TArray<FState,_FState>::Grow(&local_178,1);
    uVar11 = (ulong)local_178.Count;
    local_178.Array[uVar11].Misc1 = (undefined4)local_d8;
    local_178.Array[uVar11].Misc2 = local_d8._4_4_;
    pFVar8 = local_178.Array + uVar11;
    pFVar8->sprite = (undefined4)local_e8;
    pFVar8->Tics = local_e8._4_2_;
    pFVar8->TicRange = local_e8._6_2_;
    *(undefined8 *)(&pFVar8->sprite + 2) = uStack_e0;
    local_178.Array[uVar11].NextState = (FState *)local_f8._0_8_;
    local_178.Array[uVar11].ActionFunc = (VMFunction *)local_f8._8_8_;
    local_178.Count = local_178.Count + 1;
    TArray<FScriptPosition,_FScriptPosition>::Grow(&local_118,1);
    FScriptPosition::FScriptPosition(local_118.Array + ((ulong)local_118._8_8_ >> 0x20),&local_48);
    local_118.Count = local_118.Count + 1;
    info->NumOwnedStates = info->NumOwnedStates + 1;
    FString::~FString(&local_48.FileName);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)info->NumOwnedStates;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar11 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  pFVar8 = (FState *)operator_new__(uVar11);
  info->OwnedStates = pFVar8;
  SaveStateSourceLines(pFVar8,&local_118);
  memcpy(info->OwnedStates,local_178.Array,(long)info->NumOwnedStates * 0x28);
  if (info->NumOwnedStates == 1) {
    pFVar8 = info->OwnedStates;
    pFVar8->Tics = -1;
    pFVar8->TicRange = 0;
    pFVar8->Misc1 = 0;
  }
  else {
    uVar9 = uStack_150 & 0xffffffff;
    uVar11 = uVar9;
    if ((uint)uStack_150 < uStack_150._4_4_ - 1U) {
      pFVar8 = info->OwnedStates + uVar9;
      do {
        uVar11 = uVar11 + 1;
        pFVar8->NextState = pFVar8 + 1;
        pFVar8 = pFVar8 + 1;
      } while (uStack_150._4_4_ - 1U != uVar11);
    }
    pFVar8 = info->OwnedStates;
    pFVar8[uVar11].NextState = pFVar8 + uVar9;
    if (local_148._4_4_ != 0) {
      uVar9 = local_148 & 0xffffffff;
      uVar11 = uVar9;
      if ((uint)local_148 < local_148._4_4_ - 1) {
        pFVar16 = pFVar8 + uVar9;
        do {
          uVar11 = uVar11 + 1;
          pFVar16->NextState = pFVar16 + 1;
          pFVar16 = pFVar16 + 1;
        } while (local_148._4_4_ - 1 != uVar11);
      }
      if ((def == DEF_Projectile) || (uStack_130._3_1_ != '\0')) {
        pFVar8[uVar11].NextState = (FState *)0x0;
      }
      else {
        pFVar8[uVar11].Tics = -1;
        pFVar8[uVar11].TicRange = 0;
        pFVar8[uVar11].Misc1 = 0;
      }
      if (def == DEF_Projectile) {
        if (uStack_130._5_1_ == '\x01') {
          FState::SetAction(pFVar8 + uVar9,"A_Explode");
        }
      }
      else {
        FState::SetAction(pFVar8 + uVar9,"A_Scream");
        if ((char)uStack_130 == '\0') {
          uVar13 = (uint)local_148 + 1;
          uVar10 = (uint)local_148;
          if (uVar13 < local_148._4_4_) {
            uVar10 = uVar13;
          }
          pcVar15 = "A_ScreamAndUnblock";
          if (uVar13 < local_148._4_4_) {
            pcVar15 = "A_NoBlocking";
          }
          FState::SetAction(info->OwnedStates + uVar10,pcVar15);
        }
        if ((local_128 == 0.0) && (!NAN(local_128))) {
          local_128 = *(double *)((info->super_PClass).Defaults + 0x180);
        }
        info->DeathHeight = local_128;
      }
      FStateDefinitions::SetStateLabel
                (&local_c8.statedef,"Death",info->OwnedStates + (local_148 & 0xffffffff),'\x01');
    }
    if (local_138._4_4_ != 0) {
      uVar9 = local_138 & 0xffffffff;
      uVar11 = uVar9;
      if ((uint)local_138 < local_138._4_4_ - 1) {
        pFVar8 = info->OwnedStates + uVar9;
        do {
          uVar11 = uVar11 + 1;
          pFVar8->NextState = pFVar8 + 1;
          pFVar8 = pFVar8 + 1;
        } while (local_138._4_4_ - 1 != uVar11);
      }
      pFVar8 = info->OwnedStates;
      if (uStack_130._2_1_ == '\x01') {
        pFVar8[uVar11].NextState = (FState *)0x0;
      }
      else {
        pFVar8[uVar11].Tics = -1;
        pFVar8[uVar11].TicRange = 0;
        pFVar8[uVar11].Misc1 = 0;
      }
      FState::SetAction(info->OwnedStates + uVar9,"A_ActiveSound");
      if (uStack_130._1_1_ == '\0') {
        uVar13 = (uint)local_138 + 1;
        uVar10 = (uint)local_138;
        if (uVar13 < local_138._4_4_) {
          uVar10 = uVar13;
        }
        pcVar15 = "A_ActiveAndUnblock";
        if (uVar13 < local_138._4_4_) {
          pcVar15 = "A_NoBlocking";
        }
        FState::SetAction(info->OwnedStates + uVar10,pcVar15);
      }
      if ((dStack_120 == 0.0) && (!NAN(dStack_120))) {
        dStack_120 = *(double *)((info->super_PClass).Defaults + 0x180);
      }
      info->BurnHeight = dStack_120;
      FStateDefinitions::SetStateLabel
                (&local_c8.statedef,"Burn",info->OwnedStates + (local_138 & 0xffffffff),'\x01');
    }
    if (uStack_140._4_4_ == 0) {
      if (uStack_130._4_1_ != '\x01') goto LAB_0054031e;
      local_38.Index = 0x95;
      pFVar8 = PClassActor::FindState
                         ((PClassActor *)AActor::RegistrationInfo.MyClass,1,&local_38,false);
    }
    else {
      uVar11 = uStack_140 & 0xffffffff;
      if ((uint)uStack_140 < uStack_140._4_4_ - 1U) {
        pFVar8 = info->OwnedStates + uVar11;
        do {
          uVar11 = uVar11 + 1;
          pFVar8->NextState = pFVar8 + 1;
          pFVar8 = pFVar8 + 1;
        } while (uStack_140._4_4_ - 1U != uVar11);
      }
      pFVar8 = info->OwnedStates + uVar11;
      pFVar8->NextState = info->OwnedStates + (long)info->NumOwnedStates + -1;
      pFVar8->Tics = 5;
      pFVar8->TicRange = 0;
      pFVar8->Misc1 = 0;
      FState::SetAction(pFVar8,"A_FreezeDeath");
      iVar6 = info->NumOwnedStates;
      pFVar8 = info->OwnedStates;
      pFVar16 = pFVar8 + (long)iVar6 + -1;
      pFVar16->NextState = pFVar16;
      pFVar8[(long)iVar6 + -1].Tics = 1;
      pFVar8[(long)iVar6 + -1].TicRange = 0;
      pFVar8[(long)iVar6 + -1].Misc1 = 0;
      FState::SetAction(pFVar16,"A_FreezeDeathChunks");
      pFVar8 = info->OwnedStates + (uStack_140 & 0xffffffff);
    }
    FStateDefinitions::SetStateLabel(&local_c8.statedef,"Ice",pFVar8,'\x01');
  }
LAB_0054031e:
  if (def == DEF_BreakableDecoration) {
    uVar13 = 4;
  }
  else {
    if (def != DEF_Projectile) goto LAB_00540341;
    uVar13 = 0x10400;
  }
  puVar1 = (uint *)((info->super_PClass).Defaults + 0x1bc);
  *puVar1 = *puVar1 | uVar13;
LAB_00540341:
  FStateDefinitions::SetStateLabel
            (&local_c8.statedef,"Spawn",info->OwnedStates + (uStack_150 & 0xffffffff),'\x01');
  FStateDefinitions::InstallStates(&local_c8.statedef,info,(AActor *)(info->super_PClass).Defaults);
  TArray<FScriptPosition,_FScriptPosition>::~TArray(&local_118);
  TArray<FState,_FState>::~TArray(&local_178);
  FString::~FString(&local_c8.ScriptPosition.FileName);
  TArray<FScriptPosition,_FScriptPosition>::~TArray(&local_c8.statedef.SourceLines);
  TArray<FState,_FState>::~TArray(&local_c8.statedef.StateArray);
  TArray<FStateDefine,_FStateDefine>::~TArray(&local_c8.statedef.StateLabels);
  FString::~FString(&local_c8.ClassName);
  return;
}

Assistant:

void ParseOldDecoration(FScanner &sc, EDefinitionType def)
{
	Baggage bag;
	TArray<FState> StateArray;
	TArray<FScriptPosition> SourceLines;
	FExtraInfo extra;
	PClassActor *type;
	PClassActor *parent;
	FName typeName;

	parent = (def == DEF_Pickup) ? RUNTIME_CLASS(AFakeInventory) : RUNTIME_CLASS(AActor);

	sc.MustGetString();
	typeName = FName(sc.String);
	type = DecoDerivedClass(FScriptPosition(sc), parent, typeName);
	ResetBaggage(&bag, parent);
	bag.Info = type;
	bag.fromDecorate = true;
#ifdef _DEBUG
	bag.ClassName = type->TypeName;
#endif

	type->GameFilter = GAME_Any;
	sc.MustGetStringName("{");

	memset (&extra, 0, sizeof(extra));
	ParseInsideDecoration (bag, (AActor *)(type->Defaults), extra, def, sc, StateArray, SourceLines);

	bag.Info->NumOwnedStates = StateArray.Size();
	if (bag.Info->NumOwnedStates == 0)
	{
		sc.ScriptError ("%s does not define any animation frames", typeName.GetChars() );
	}
	else if (extra.SpawnEnd == 0)
	{
		sc.ScriptError ("%s does not have a Frames definition", typeName.GetChars() );
	}
	else if (def == DEF_BreakableDecoration && extra.DeathEnd == 0)
	{
		sc.ScriptError ("%s does not have a DeathFrames definition", typeName.GetChars() );
	}
	else if (extra.IceDeathEnd != 0 && extra.bGenericIceDeath)
	{
		sc.ScriptError ("You cannot use IceDeathFrames and GenericIceDeath together");
	}

	if (extra.IceDeathEnd != 0)
	{
		// Make a copy of the final frozen frame for A_FreezeDeathChunks
		FState icecopy = StateArray[extra.IceDeathEnd-1];
		FScriptPosition icepos = SourceLines[extra.IceDeathEnd - 1];
		StateArray.Push (icecopy);
		SourceLines.Push(icepos);
		type->NumOwnedStates += 1;
	}

	type->OwnedStates = new FState[type->NumOwnedStates];
	SaveStateSourceLines(type->OwnedStates, SourceLines);
	memcpy (type->OwnedStates, &StateArray[0], type->NumOwnedStates * sizeof(type->OwnedStates[0]));
	if (type->NumOwnedStates == 1)
	{
		type->OwnedStates->Tics = -1;
		type->OwnedStates->TicRange = 0;
		type->OwnedStates->Misc1 = 0;
	}
	else
	{
		size_t i;

		// Spawn states loop endlessly
		for (i = extra.SpawnStart; i < extra.SpawnEnd-1; ++i)
		{
			type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
		}
		type->OwnedStates[i].NextState = &type->OwnedStates[extra.SpawnStart];

		// Death states are one-shot and freeze on the final state
		if (extra.DeathEnd != 0)
		{
			for (i = extra.DeathStart; i < extra.DeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bDiesAway || def == DEF_Projectile)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			if (def == DEF_Projectile)
			{
				if (extra.bExplosive)
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_Explode");
				}
			}
			else
			{
				// The first frame plays the death sound and
				// the second frame makes it nonsolid.
				type->OwnedStates[extra.DeathStart].SetAction("A_Scream");
				if (extra.bSolidOnDeath)
				{
				}
				else if (extra.DeathStart + 1 < extra.DeathEnd)
				{
					type->OwnedStates[extra.DeathStart+1].SetAction("A_NoBlocking");
				}
				else
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_ScreamAndUnblock");
				}

				if (extra.DeathHeight == 0)
				{
					extra.DeathHeight = ((AActor*)(type->Defaults))->Height;
				}
				type->DeathHeight = extra.DeathHeight;
			}
			bag.statedef.SetStateLabel("Death", &type->OwnedStates[extra.DeathStart]);
		}

		// Burn states are the same as death states, except they can optionally terminate
		if (extra.FireDeathEnd != 0)
		{
			for (i = extra.FireDeathStart; i < extra.FireDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bBurnAway)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			// The first frame plays the burn sound and
			// the second frame makes it nonsolid.
			type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveSound");
			if (extra.bSolidOnBurn)
			{
			}
			else if (extra.FireDeathStart + 1 < extra.FireDeathEnd)
			{
				type->OwnedStates[extra.FireDeathStart+1].SetAction("A_NoBlocking");
			}
			else
			{
				type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveAndUnblock");
			}

			if (extra.BurnHeight == 0) extra.BurnHeight = ((AActor*)(type->Defaults))->Height;
			type->BurnHeight = extra.BurnHeight;

			bag.statedef.SetStateLabel("Burn", &type->OwnedStates[extra.FireDeathStart]);
		}

		// Ice states are similar to burn and death, except their final frame enters
		// a loop that eventually causes them to bust to pieces.
		if (extra.IceDeathEnd != 0)
		{
			for (i = extra.IceDeathStart; i < extra.IceDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			type->OwnedStates[i].NextState = &type->OwnedStates[type->NumOwnedStates-1];
			type->OwnedStates[i].Tics = 5;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeath");

			i = type->NumOwnedStates - 1;
			type->OwnedStates[i].NextState = &type->OwnedStates[i];
			type->OwnedStates[i].Tics = 1;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeathChunks");
			bag.statedef.SetStateLabel("Ice", &type->OwnedStates[extra.IceDeathStart]);
		}
		else if (extra.bGenericIceDeath)
		{
			bag.statedef.SetStateLabel("Ice", RUNTIME_CLASS(AActor)->FindState(NAME_GenericFreezeDeath));
		}
	}
	if (def == DEF_BreakableDecoration)
	{
		((AActor *)(type->Defaults))->flags |= MF_SHOOTABLE;
	}
	if (def == DEF_Projectile)
	{
		((AActor *)(type->Defaults))->flags |= MF_DROPOFF|MF_MISSILE;
	}
	bag.statedef.SetStateLabel("Spawn", &type->OwnedStates[extra.SpawnStart]);
	bag.statedef.InstallStates (type, ((AActor *)(type->Defaults)));
}